

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngmem.c
# Opt level: O2

png_voidp png_malloc_array_checked(png_const_structrp png_ptr,int nelements,size_t element_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  png_voidp pvVar3;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = element_size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = CONCAT44(0,nelements);
  if (SUB168(auVar1 * auVar2,8) != 0) {
    return (png_voidp)0x0;
  }
  pvVar3 = png_malloc_base(png_ptr,CONCAT44(0,nelements) * element_size);
  return pvVar3;
}

Assistant:

static png_voidp
png_malloc_array_checked(png_const_structrp png_ptr, int nelements,
    size_t element_size)
{
   png_alloc_size_t req = (png_alloc_size_t)nelements; /* known to be > 0 */

   if (req <= PNG_SIZE_MAX/element_size)
      return png_malloc_base(png_ptr, req * element_size);

   /* The failure case when the request is too large */
   return NULL;
}